

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::StructBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  IdlNamer *pIVar1;
  FieldDef *pFVar2;
  Namespace *current_namespace;
  pointer ppVar3;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::append((char *)code);
  pIVar1 = &this->namer_;
  for (ppVar3 = (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    pFVar2 = ppVar3->second;
    (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_b0,pIVar1,pFVar2);
    if (((pFVar2->value).type.base_type == BASE_TYPE_STRUCT) &&
       (((pFVar2->value).type.struct_def)->fixed == true)) {
      std::__cxx11::string::append((char *)code);
    }
    else {
      current_namespace = (struct_def->super_Definition).defined_namespace;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"",(allocator<char> *)&local_d0);
      GenDartTypeName(&local_90,this,&(pFVar2->value).type,current_namespace,pFVar2,&local_50);
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator+(&local_90," ",&local_b0);
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_90);
    if (ppVar3 != (non_deprecated_fields->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish + -1) {
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::append((char *)code);
  for (ppVar3 = (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 != (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 = ppVar3 + -1) {
    pFVar2 = ppVar3[-1].second;
    (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_b0,pIVar1,pFVar2);
    if (pFVar2->padding != 0) {
      NumToString<unsigned_long>(&local_70,pFVar2->padding);
      std::operator+(&local_d0,"    fbBuilder.pad(",&local_70);
      std::operator+(&local_90,&local_d0,");\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (((pFVar2->value).type.base_type == BASE_TYPE_STRUCT) &&
       (((pFVar2->value).type.struct_def)->fixed == true)) {
      std::operator+(&local_d0,"    ",&local_b0);
      std::operator+(&local_90,&local_d0,"();\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      GenType_abi_cxx11_(&local_70,this,&(pFVar2->value).type);
      std::operator+(&local_d0,"    fbBuilder.put",&local_70);
      std::operator+(&local_90,&local_d0,"(");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((string *)code);
      if ((pFVar2->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::append((char *)code);
      }
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  return;
}

Assistant:

void StructBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  int finish(";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (IsStruct(field.value.type)) {
        code += "fb.StructBuilder";
      } else {
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
      }
      code += " " + field_name;
      if (it != non_deprecated_fields.end() - 1) { code += ", "; }
    }
    code += ") {\n";

    for (auto it = non_deprecated_fields.rbegin();
         it != non_deprecated_fields.rend(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (field.padding) {
        code += "    fbBuilder.pad(" + NumToString(field.padding) + ");\n";
      }

      if (IsStruct(field.value.type)) {
        code += "    " + field_name + "();\n";
      } else {
        code += "    fbBuilder.put" + GenType(field.value.type) + "(";
        code += field_name;
        if (field.value.type.enum_def) { code += ".value"; }
        code += ");\n";
      }
    }
    code += "    return fbBuilder.offset;\n";
    code += "  }\n\n";
  }